

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O3

void small_mempool_create_groups(small_alloc *alloc,small_mempool *first,small_mempool *last)

{
  undefined1 uVar1;
  slab_cache *psVar2;
  small_mempool_group *psVar3;
  small_mempool *psVar4;
  uint uVar5;
  byte bVar6;
  long lVar7;
  small_mempool *psVar8;
  uint uVar9;
  small_mempool *psVar10;
  uint32_t uVar11;
  small_mempool *psVar12;
  uint i;
  uint uVar13;
  long lVar14;
  small_mempool *psVar15;
  bool bVar16;
  
  if (first <= last) {
    uVar11 = alloc->small_mempool_groups_size;
    do {
      psVar12 = first;
      if (first < last) {
        bVar6 = 0;
        do {
          psVar12 = psVar12 + 1;
          if (last <= psVar12) break;
          bVar16 = bVar6 < 0x1e;
          bVar6 = bVar6 + 1;
        } while (bVar16);
      }
      alloc->small_mempool_groups[uVar11].first = first;
      alloc->small_mempool_groups[uVar11].last = psVar12;
      alloc->small_mempool_groups[uVar11].active_pool_mask = 0;
      psVar2 = (psVar12->pool).cache;
      bVar6 = (psVar12->pool).slab_order;
      if (psVar2->order_max < bVar6) {
        __assert_fail("order <= cache->order_max",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/slab_cache.h"
                      ,0xee,"intptr_t slab_order_size(struct slab_cache *, uint8_t)");
      }
      uVar1 = psVar2->order0_size_lb;
      lVar14 = 1L << (bVar6 + uVar1 & 0x3f);
      lVar7 = lVar14 + 3;
      if (-1 < lVar14) {
        lVar7 = lVar14;
      }
      alloc->small_mempool_groups[uVar11].waste_max = lVar7 >> 2;
      for (psVar8 = first; psVar8 <= psVar12; psVar8 = psVar8 + 1) {
        psVar8->group = alloc->small_mempool_groups + uVar11;
        if (psVar8->appropriate_pool_mask != 0) {
          __assert_fail("small_mempool->appropriate_pool_mask == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                        ,0xa5,"void small_mempool_set_mask(struct small_mempool *)");
        }
        uVar13 = (int)((ulong)((long)psVar8 - (long)first) >> 3) * 0x286bca1b;
        if (uVar13 < 0x20) {
          uVar9 = 0;
          do {
            uVar9 = uVar9 | 1 << (uVar13 & 0x1f);
            uVar13 = uVar13 + 1;
          } while (uVar13 != 0x20);
          psVar8->appropriate_pool_mask = uVar9;
        }
      }
      uVar11 = uVar11 + 1;
      alloc->small_mempool_groups_size = uVar11;
      psVar3 = psVar12->group;
      psVar8 = psVar3->first;
      uVar13 = ((uint)((int)psVar12 - (int)psVar8) >> 3) * 0x1b;
      if ((psVar3->active_pool_mask >> (uVar13 & 0x1f) & 1) != 0) {
        __assert_fail("(small_mempool->group->active_pool_mask & (UINT32_C(1) << idx)) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                      ,0x57,"void small_mempool_activate(struct small_mempool *)");
      }
      uVar13 = 1 << ((byte)uVar13 & 0x1f) | psVar3->active_pool_mask;
      psVar3->active_pool_mask = uVar13;
      psVar4 = psVar3->last;
      for (psVar15 = psVar8; psVar15 <= psVar4; psVar15 = psVar15 + 1) {
        uVar9 = psVar15->appropriate_pool_mask & uVar13;
        if (uVar9 == 0) {
          __assert_fail("used_idx >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                        ,0x38,"void small_mempool_update_group(struct small_mempool *)");
        }
        uVar5 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        psVar10 = psVar8 + uVar5;
        psVar15->used_pool = psVar10;
        if (psVar10 < psVar15) {
          __assert_fail("pool->used_pool >= pool",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                        ,0x3a,"void small_mempool_update_group(struct small_mempool *)");
        }
        if ((psVar10->pool).objsize < (psVar15->pool).objsize) {
          __assert_fail("pool->pool.objsize <= pool->used_pool->pool.objsize",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                        ,0x3b,"void small_mempool_update_group(struct small_mempool *)");
        }
      }
      first = psVar12 + 1;
    } while (first <= last);
  }
  return;
}

Assistant:

static inline void
small_mempool_create_groups(struct small_alloc *alloc,
			    struct small_mempool *first,
			    struct small_mempool *last)
{
	struct small_mempool *first_in_group = first;
	while (first_in_group <= last) {
		struct small_mempool *last_in_group =
			small_mempool_group_last_pool(first_in_group, last);
		small_mempool_create_group(alloc, first_in_group,
					   last_in_group);
		first_in_group = last_in_group + 1;
	}
}